

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# title.c
# Opt level: O0

int title_screen(void)

{
  ALLEGRO_COLOR c;
  ALLEGRO_COLOR c_00;
  ALLEGRO_COLOR c_01;
  ALLEGRO_COLOR c_02;
  ALLEGRO_COLOR c_03;
  ALLEGRO_COLOR c_04;
  ALLEGRO_COLOR c_05;
  ALLEGRO_COLOR c_06;
  ALLEGRO_COLOR c_07;
  ALLEGRO_COLOR c_08;
  float fVar1;
  int iVar2;
  int iVar3;
  ALLEGRO_BITMAP *pAVar4;
  ALLEGRO_BITMAP *pAVar5;
  int64_t iVar6;
  bool bVar7;
  undefined8 uVar8;
  ALLEGRO_COLOR AVar9;
  int y;
  int j;
  int i;
  ALLEGRO_COLOR white;
  ALLEGRO_BITMAP *b;
  ALLEGRO_BITMAP *bmp;
  int SCREEN_H;
  int SCREEN_W;
  int in_stack_00000308;
  int in_stack_0000030c;
  int in_stack_00000310;
  int in_stack_00000314;
  ALLEGRO_BITMAP *in_stack_00000318;
  ALLEGRO_BITMAP *in_stack_00000320;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ALLEGRO_FONT *pAVar10;
  char *msg;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar11;
  int in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined8 local_9c;
  undefined8 local_54;
  int local_38;
  int local_34;
  int local_4;
  
  fVar1 = (float)al_get_display_width(screen);
  iVar2 = al_get_display_height(screen);
  AVar9 = makecol(CONCAT13(in_stack_ffffffffffffff07,
                           CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                  in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  local_54 = AVar9._8_8_;
  pAVar4 = create_memory_bitmap
                     (CONCAT13(in_stack_ffffffffffffff07,
                               CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                      in_stack_ffffffffffffff00);
  al_set_target_bitmap(pAVar4);
  al_set_blender(0);
  for (local_34 = 0; local_34 < iVar2 / 2; local_34 = local_34 + 1) {
    in_stack_ffffffffffffff40 = local_34;
    in_stack_ffffffffffffff44 = fVar1;
    makecol(CONCAT13(in_stack_ffffffffffffff07,
                     CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
            in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    AVar9.b = (float)in_stack_ffffffffffffff10;
    AVar9.r = (float)(int)in_stack_ffffffffffffff08;
    AVar9.g = (float)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    AVar9.a = in_stack_ffffffffffffff14;
    hline(CONCAT13(in_stack_ffffffffffffff07,
                   CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
          in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,AVar9);
    AVar9 = makecol(CONCAT13(in_stack_ffffffffffffff07,
                             CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                    in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    local_54 = AVar9._8_8_;
    c.b = (float)in_stack_ffffffffffffff10;
    c.r = (float)(int)in_stack_ffffffffffffff08;
    c.g = (float)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    c.a = in_stack_ffffffffffffff14;
    hline(CONCAT13(in_stack_ffffffffffffff07,
                   CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
          in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,c);
  }
  uVar11 = 0;
  solid_mode();
  pAVar5 = create_memory_bitmap
                     (CONCAT13(in_stack_ffffffffffffff07,
                               CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                      in_stack_ffffffffffffff00);
  al_set_target_bitmap(pAVar5);
  uVar8 = al_map_rgba(uVar11,uVar11,uVar11);
  al_clear_to_color(uVar8,local_54);
  makecol(CONCAT13(in_stack_ffffffffffffff07,
                   CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
          in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  msg = "SPEED";
  c_00.b = (float)in_stack_ffffffffffffff10;
  c_00.r = (float)(int)in_stack_ffffffffffffff08;
  c_00.g = (float)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  c_00.a = in_stack_ffffffffffffff14;
  textout((ALLEGRO_FONT *)
          CONCAT17(in_stack_ffffffffffffff07,
                   CONCAT16(in_stack_ffffffffffffff06,
                            CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
          (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0,0x10cb7b,c_00);
  stretch_sprite(in_stack_00000320,in_stack_00000318,in_stack_00000314,in_stack_00000310,
                 in_stack_0000030c,in_stack_00000308);
  pAVar10 = font;
  makecol(CONCAT13(in_stack_ffffffffffffff07,
                   CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
          in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  c_01.b = (float)in_stack_ffffffffffffff10;
  c_01.r = (float)(int)in_stack_ffffffffffffff08;
  c_01.g = (float)(int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  c_01.a = in_stack_ffffffffffffff14;
  textout((ALLEGRO_FONT *)
          CONCAT17(in_stack_ffffffffffffff07,
                   CONCAT16(in_stack_ffffffffffffff06,
                            CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
          (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0,0x10cc26,c_01);
  stretch_sprite(in_stack_00000320,in_stack_00000318,in_stack_00000314,in_stack_00000310,
                 in_stack_0000030c,in_stack_00000308);
  al_set_target_bitmap(pAVar4);
  al_destroy_bitmap(pAVar5);
  c_02.g = (float)uVar11;
  c_02.r = (float)in_stack_ffffffffffffff38;
  c_02.b = (float)in_stack_ffffffffffffff40;
  c_02.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_02);
  c_03.g = (float)uVar11;
  c_03.r = (float)in_stack_ffffffffffffff38;
  c_03.b = (float)in_stack_ffffffffffffff40;
  c_03.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_03);
  c_04.g = (float)uVar11;
  c_04.r = (float)in_stack_ffffffffffffff38;
  c_04.b = (float)in_stack_ffffffffffffff40;
  c_04.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_04);
  c_05.g = (float)uVar11;
  c_05.r = (float)in_stack_ffffffffffffff38;
  c_05.b = (float)in_stack_ffffffffffffff40;
  c_05.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_05);
  c_06.g = (float)uVar11;
  c_06.r = (float)in_stack_ffffffffffffff38;
  c_06.b = (float)in_stack_ffffffffffffff40;
  c_06.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_06);
  c_07.g = (float)uVar11;
  c_07.r = (float)in_stack_ffffffffffffff38;
  c_07.b = (float)in_stack_ffffffffffffff40;
  c_07.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_07);
  c_08.g = (float)uVar11;
  c_08.r = (float)in_stack_ffffffffffffff38;
  c_08.b = (float)in_stack_ffffffffffffff40;
  c_08.a = in_stack_ffffffffffffff44;
  textout_shadow(msg,(int)((ulong)pAVar10 >> 0x20),(int)pAVar10,c_08);
  uVar8 = al_get_backbuffer(screen);
  al_set_target_bitmap(uVar8);
  pAVar4 = replace_bitmap((ALLEGRO_BITMAP *)
                          CONCAT17(in_stack_ffffffffffffff07,
                                   CONCAT16(in_stack_ffffffffffffff06,
                                            CONCAT24(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00))));
  start_retrace_count();
  for (local_34 = 0; local_34 <= iVar2 / 0x10; local_34 = local_34 + 1) {
    AVar9 = makecol(CONCAT13(in_stack_ffffffffffffff07,
                             CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)),
                    in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    local_9c = AVar9._0_8_;
    al_clear_to_color(local_9c);
    for (local_38 = 0; local_38 < 0x11; local_38 = local_38 + 1) {
      iVar3 = local_38 * (iVar2 / 0x10);
      al_draw_bitmap_region
                (0,(float)iVar3,(float)(int)fVar1,(float)local_34,0,(float)iVar3,pAVar4,0,
                 (long)iVar2 % 0x10 & 0xffffffff);
    }
    al_flip_display();
    do {
      poll_input_wait();
      iVar6 = retrace_count();
    } while (iVar6 < (local_34 << 10) / (int)fVar1);
  }
  stop_retrace_count();
  while( true ) {
    bVar7 = true;
    if (((joy_b1 == 0) && (bVar7 = true, key[0x4b] == 0)) && (bVar7 = true, key[0x43] == 0)) {
      bVar7 = key[0x3b] != 0;
    }
    if (!bVar7) break;
    poll_input_wait();
  }
  while( true ) {
    bVar7 = false;
    if (((key[0x4b] == 0) && (bVar7 = false, key[0x43] == 0)) && (bVar7 = false, key[0x3b] == 0)) {
      bVar7 = joy_b1 == 0;
    }
    if (!bVar7) break;
    poll_input_wait();
    al_draw_bitmap(0,pAVar4,0);
    al_flip_display();
  }
  al_destroy_bitmap(pAVar4);
  if (key[0x3b] == 0) {
    sfx_ping(0);
    local_4 = -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int title_screen()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   ALLEGRO_BITMAP *bmp, *b;
   ALLEGRO_COLOR white = makecol(255, 255, 255);
   int i, j, y;

   bmp = create_memory_bitmap(SCREEN_W, SCREEN_H);
   al_set_target_bitmap(bmp);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);

   for (i=0; i<SCREEN_H/2; i++) {
      hline(0, i, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
      hline(0, SCREEN_H-i-1, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
   }

   solid_mode();

   b = create_memory_bitmap(40, 8);
   al_set_target_bitmap(b);
   al_clear_to_color(al_map_rgba(0, 0, 0, 0));

   textout(font, "SPEED", 0, 0, makecol(0, 0, 0));
   stretch_sprite(bmp, b, SCREEN_W/128+8, SCREEN_H/24+8, SCREEN_W, SCREEN_H);

   textout(font, "SPEED", 0, 0, makecol(0, 0, 64));
   stretch_sprite(bmp, b, SCREEN_W/128, SCREEN_H/24, SCREEN_W, SCREEN_H);

   al_set_target_bitmap(bmp);

   al_destroy_bitmap(b);

   textout_shadow("Simultaneous Projections", SCREEN_W/2, SCREEN_H/2-80, white);
   textout_shadow("Employing an Ensemble of Displays", SCREEN_W/2, SCREEN_H/2-64, white);

   textout_shadow("Or alternatively: Stupid Pointless", SCREEN_W/2, SCREEN_H/2-32, white);
   textout_shadow("Effort at Establishing a Dumb Acronym", SCREEN_W/2, SCREEN_H/2-16, white);

   textout_shadow("By Shawn Hargreaves, 1999", SCREEN_W/2, SCREEN_H/2+16, white);
   textout_shadow("Written for the Allegro", SCREEN_W/2, SCREEN_H/2+48, white);
   textout_shadow("SpeedHack competition", SCREEN_W/2, SCREEN_H/2+64, white);

   al_set_target_bitmap(al_get_backbuffer(screen));

   bmp = replace_bitmap(bmp);

   start_retrace_count();

   for (i=0; i<=SCREEN_H/16; i++) {
      al_clear_to_color(makecol(0, 0, 0));

      for (j=0; j<=16; j++) {
	 y = j*(SCREEN_H/16);
	 al_draw_bitmap_region(bmp, 0, y, SCREEN_W, i, 0, y, 0);
      }

      al_flip_display();

      do {
	 poll_input_wait();
      } while (retrace_count() < i*1024/SCREEN_W);
   }

   stop_retrace_count();

   while (joy_b1 || key[ALLEGRO_KEY_SPACE] || key[ALLEGRO_KEY_ENTER] || key[ALLEGRO_KEY_ESCAPE])
      poll_input_wait();

   while (!key[ALLEGRO_KEY_SPACE] && !key[ALLEGRO_KEY_ENTER] && !key[ALLEGRO_KEY_ESCAPE] && !joy_b1) {
      poll_input_wait();
      al_draw_bitmap(bmp, 0, 0, 0);
      al_flip_display();
   }

   al_destroy_bitmap(bmp);

   if (key[ALLEGRO_KEY_ESCAPE])
      return FALSE;

   sfx_ping(2);

   return TRUE;
}